

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_lazy2_dedicatedDictSearch_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  int iVar4;
  char cVar5;
  undefined8 uVar6;
  seqStore_t *psVar7;
  uint uVar8;
  uint uVar9;
  U32 UVar10;
  size_t sVar11;
  ulong uVar12;
  seqDef *psVar13;
  BYTE *iEnd;
  BYTE *pBVar14;
  BYTE *pBVar15;
  long lVar16;
  int *ip;
  int *piVar17;
  int *piVar18;
  uint uVar19;
  int *piVar20;
  uint uVar21;
  uint uVar22;
  U32 UVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  size_t offbaseFound;
  uint local_c0;
  U32 local_bc;
  ulong local_b8;
  int *local_b0;
  U32 local_a4;
  BYTE *litEnd;
  ulong local_98;
  seqStore_t *local_90;
  BYTE *local_88;
  ulong local_80;
  int *local_78;
  uint local_6c;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *litLimit_w;
  BYTE *local_50;
  BYTE *local_48;
  U32 *local_40;
  ZSTD_matchState_t *local_38;
  
  pBVar2 = (ms->window).base;
  uVar9 = (ms->window).dictLimit;
  local_98 = (ulong)uVar9;
  local_88 = pBVar2 + local_98;
  uVar19 = (ms->cParams).minMatch;
  if (5 < uVar19) {
    uVar19 = 6;
  }
  if (uVar19 < 5) {
    uVar19 = 4;
  }
  local_6c = (ms->cParams).searchLog;
  local_c0 = 6;
  if (local_6c < 6) {
    local_c0 = local_6c;
  }
  if (local_c0 < 5) {
    local_c0 = 4;
  }
  pZVar3 = ms->dictMatchState;
  local_60 = (pZVar3->window).base;
  local_48 = local_60 + (pZVar3->window).dictLimit;
  local_68 = (pZVar3->window).nextSrc;
  local_bc = *rep;
  UVar10 = rep[1];
  ms->lazySkipping = 0;
  local_78 = (int *)((long)src + (srcSize - 0x10));
  uVar8 = ms->nextToUpdate;
  uVar26 = (ulong)uVar8;
  uVar22 = ((int)local_78 - (int)(pBVar2 + uVar26)) + 1;
  if (7 < uVar22) {
    uVar22 = 8;
  }
  uVar21 = 0;
  if (pBVar2 + uVar26 <= local_78) {
    uVar21 = uVar22;
  }
  cVar5 = (char)ms->rowHashLog;
  iEnd = (BYTE *)((long)src + srcSize);
  for (; uVar26 < uVar21 + uVar8; uVar26 = uVar26 + 1) {
    if (uVar19 == 5) {
      uVar24 = *(long *)(pBVar2 + uVar26) * -0x30e4432345000000;
LAB_00398063:
      UVar23 = (U32)((uVar24 ^ ms->hashSalt) >> (0x38U - cVar5 & 0x3f));
    }
    else {
      if (uVar19 == 6) {
        uVar24 = *(long *)(pBVar2 + uVar26) * -0x30e4432340650000;
        goto LAB_00398063;
      }
      UVar23 = (*(int *)(pBVar2 + uVar26) * -0x61c8864f ^ (uint)ms->hashSalt) >>
               (0x18U - cVar5 & 0x1f);
    }
    ms->hashCache[(uint)uVar26 & 7] = UVar23;
  }
  local_80 = (ulong)(((int)local_60 - (int)local_68) + uVar9);
  ip = (int *)((ulong)(((int)src - ((int)local_48 + (int)local_88)) + (int)local_68 == 0) +
              (long)src);
  local_50 = local_60 + -local_80;
  litLimit_w = iEnd + -0x20;
  piVar20 = (int *)src;
  local_90 = seqStore;
  local_40 = rep;
  do {
    while( true ) {
      local_a4 = UVar10;
      local_b0 = piVar20;
      uVar9 = local_c0;
      if (local_78 <= ip) {
        *local_40 = local_bc;
        local_40[1] = local_a4;
        return (long)iEnd - (long)local_b0;
      }
      litEnd = (BYTE *)((long)ip + 1);
      iVar25 = (int)pBVar2;
      uVar8 = (((int)ip - iVar25) - local_bc) + 1;
      piVar20 = (int *)(pBVar2 + uVar8);
      if (uVar8 < (uint)local_98) {
        piVar20 = (int *)(local_60 + (uVar8 - (int)local_80));
      }
      if ((uVar8 - (uint)local_98 < 0xfffffffd) && (*piVar20 == *(int *)litEnd)) {
        pBVar14 = iEnd;
        if (uVar8 < (uint)local_98) {
          pBVar14 = local_68;
        }
        sVar11 = ZSTD_count_2segments
                           ((BYTE *)((long)ip + 5),(BYTE *)(piVar20 + 1),iEnd,pBVar14,local_88);
        uVar26 = sVar11 + 4;
      }
      else {
        uVar26 = 0;
      }
      offbaseFound = 999999999;
      if (uVar19 == 6) {
        if (uVar9 == 6) {
          uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else if (uVar9 == 5) {
          uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else {
          uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
      }
      else if (uVar19 == 5) {
        if (uVar9 == 6) {
          uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else if (uVar9 == 5) {
          uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else {
          uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
      }
      else if (uVar9 == 6) {
        uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else if (uVar9 == 5) {
        uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else {
        uVar24 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      uVar12 = uVar26;
      if (uVar26 < uVar24) {
        uVar12 = uVar24;
      }
      if (3 < uVar12) break;
      uVar26 = (long)ip - (long)local_b0;
      ip = (int *)((long)ip + (uVar26 >> 8) + 1);
      ms->lazySkipping = (uint)(0x7ff < uVar26);
      piVar20 = local_b0;
      UVar10 = local_a4;
    }
    sVar11 = 1;
    piVar20 = (int *)litEnd;
    if (uVar26 < uVar24) {
      sVar11 = offbaseFound;
      piVar20 = ip;
    }
LAB_003982b6:
    do {
      litEnd = (BYTE *)piVar20;
      uVar26 = uVar12;
      piVar17 = ip;
      local_b8 = sVar11;
      piVar18 = local_b0;
      if (local_78 <= piVar17) break;
      ip = (int *)((long)piVar17 + 1);
      uVar9 = ((int)ip - iVar25) - local_bc;
      piVar20 = (int *)(pBVar2 + uVar9);
      if (uVar9 < (uint)local_98) {
        piVar20 = (int *)(local_60 + (uVar9 - (int)local_80));
      }
      if ((uVar9 - (uint)local_98 < 0xfffffffd) && (*piVar20 == *ip)) {
        pBVar14 = iEnd;
        if (uVar9 < (uint)local_98) {
          pBVar14 = local_68;
        }
        sVar11 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar17 + 5),(BYTE *)(piVar20 + 1),iEnd,pBVar14,local_88)
        ;
        if (sVar11 < 0xfffffffffffffffc) {
          uVar9 = 0x1f;
          if ((uint)local_b8 != 0) {
            for (; (uint)local_b8 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          if ((int)((uVar9 ^ 0x1f) + (int)uVar26 * 3 + -0x1e) < (int)(sVar11 + 4) * 3) {
            local_b8 = 1;
            uVar26 = sVar11 + 4;
            litEnd = (BYTE *)ip;
          }
        }
      }
      offbaseFound = 999999999;
      if (uVar19 == 6) {
        if (local_c0 == 6) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else if (local_c0 == 5) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
      }
      else if (uVar19 == 5) {
        if (local_c0 == 6) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else if (local_c0 == 5) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
      }
      else if (local_c0 == 6) {
        uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else if (local_c0 == 5) {
        uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else {
        uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      if (3 < uVar12) {
        uVar9 = 0x1f;
        if ((uint)local_b8 != 0) {
          for (; (uint)local_b8 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        iVar4 = 0x1f;
        if ((uint)offbaseFound != 0) {
          for (; (uint)offbaseFound >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar11 = offbaseFound;
        piVar20 = ip;
        if ((int)((uVar9 ^ 0x1f) + (int)uVar26 * 4 + -0x1b) < (int)uVar12 * 4 - iVar4)
        goto LAB_003982b6;
      }
      piVar18 = local_b0;
      if (local_78 <= ip) break;
      ip = (int *)((long)piVar17 + 2);
      uVar9 = ((int)ip - iVar25) - local_bc;
      piVar20 = (int *)(pBVar2 + uVar9);
      if (uVar9 < (uint)local_98) {
        piVar20 = (int *)(local_60 + (uVar9 - (int)local_80));
      }
      if ((uVar9 - (uint)local_98 < 0xfffffffd) && (*piVar20 == *ip)) {
        pBVar14 = iEnd;
        if (uVar9 < (uint)local_98) {
          pBVar14 = local_68;
        }
        sVar11 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar17 + 6),(BYTE *)(piVar20 + 1),iEnd,pBVar14,local_88)
        ;
        if (sVar11 < 0xfffffffffffffffc) {
          uVar9 = 0x1f;
          if ((uint)local_b8 != 0) {
            for (; (uint)local_b8 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          if ((int)((uVar9 ^ 0x1f) + (int)uVar26 * 4 + -0x1e) < (int)(sVar11 + 4) * 4) {
            local_b8 = 1;
            uVar26 = sVar11 + 4;
            litEnd = (BYTE *)ip;
          }
        }
      }
      piVar18 = local_b0;
      offbaseFound = 999999999;
      if (uVar19 == 6) {
        if (local_c0 == 6) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else if (local_c0 == 5) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
      }
      else if (uVar19 == 5) {
        if (local_c0 == 6) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else if (local_c0 == 5) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
      }
      else if (local_c0 == 6) {
        uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else if (local_c0 == 5) {
        uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else {
        uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      if (uVar12 < 4) break;
      uVar9 = 0x1f;
      if ((uint)local_b8 != 0) {
        for (; (uint)local_b8 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      iVar4 = 0x1f;
      if ((uint)offbaseFound != 0) {
        for (; (uint)offbaseFound >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar11 = offbaseFound;
      piVar20 = ip;
    } while ((int)((uVar9 ^ 0x1f) + (int)uVar26 * 4 + -0x18) < (int)uVar12 * 4 - iVar4);
    if (3 < local_b8) {
      pBVar15 = pBVar2;
      pBVar14 = local_88;
      if ((uint)(litEnd + (-0xfffffffd - (long)(pBVar2 + local_b8))) < (uint)local_98) {
        pBVar15 = local_50;
        pBVar14 = local_48;
      }
      pBVar15 = pBVar15 + ((ulong)(litEnd + (-0xfffffffd - (long)(pBVar2 + local_b8))) & 0xffffffff)
      ;
      for (; ((piVar18 < litEnd && (pBVar14 < pBVar15)) &&
             (*(BYTE *)((long)litEnd + -1) == pBVar15[-1])); litEnd = (BYTE *)((long)litEnd + -1)) {
        pBVar15 = pBVar15 + -1;
        uVar26 = uVar26 + 1;
      }
      local_a4 = local_bc;
      local_bc = (int)local_b8 - 3;
    }
    uVar24 = (long)litEnd - (long)local_b0;
    pBVar14 = local_90->lit;
    if (litLimit_w < litEnd) {
      ZSTD_safecopyLiterals(pBVar14,(BYTE *)local_b0,litEnd,litLimit_w);
LAB_003986ff:
      local_90->lit = local_90->lit + uVar24;
      psVar13 = local_90->sequences;
      if (0xffff < uVar24) {
        local_90->longLengthType = ZSTD_llt_literalLength;
        local_90->longLengthPos =
             (U32)((ulong)((long)psVar13 - (long)local_90->sequencesStart) >> 3);
      }
    }
    else {
      uVar6 = *(undefined8 *)(local_b0 + 2);
      *(undefined8 *)pBVar14 = *(undefined8 *)local_b0;
      *(undefined8 *)(pBVar14 + 8) = uVar6;
      pBVar14 = local_90->lit;
      if (0x10 < uVar24) {
        uVar6 = *(undefined8 *)(local_b0 + 6);
        *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(local_b0 + 4);
        *(undefined8 *)(pBVar14 + 0x18) = uVar6;
        if (0x20 < (long)uVar24) {
          lVar16 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_b0 + lVar16 + 0x20);
            uVar6 = puVar1[1];
            pBVar15 = pBVar14 + lVar16 + 0x20;
            *(undefined8 *)pBVar15 = *puVar1;
            *(undefined8 *)(pBVar15 + 8) = uVar6;
            puVar1 = (undefined8 *)((long)local_b0 + lVar16 + 0x30);
            uVar6 = puVar1[1];
            *(undefined8 *)(pBVar15 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar15 + 0x18) = uVar6;
            lVar16 = lVar16 + 0x20;
          } while (pBVar15 + 0x20 < pBVar14 + uVar24);
        }
        goto LAB_003986ff;
      }
      local_90->lit = pBVar14 + uVar24;
      psVar13 = local_90->sequences;
    }
    psVar7 = local_90;
    psVar13->litLength = (U16)uVar24;
    psVar13->offBase = (U32)local_b8;
    if (0xffff < uVar26 - 3) {
      local_90->longLengthType = ZSTD_llt_matchLength;
      local_90->longLengthPos = (U32)((ulong)((long)psVar13 - (long)local_90->sequencesStart) >> 3);
    }
    psVar13->mlBase = (U16)(uVar26 - 3);
    local_90->sequences = psVar13 + 1;
    if (ms->lazySkipping != 0) {
      uVar9 = ms->nextToUpdate;
      uVar24 = (ulong)uVar9;
      uVar8 = ((int)local_78 - (int)(pBVar2 + uVar24)) + 1;
      if (7 < uVar8) {
        uVar8 = 8;
      }
      if (local_78 < pBVar2 + uVar24) {
        uVar8 = 0;
      }
      cVar5 = (char)ms->rowHashLog;
      for (; uVar24 < uVar8 + uVar9; uVar24 = uVar24 + 1) {
        if (uVar19 == 5) {
          uVar12 = *(long *)(pBVar2 + uVar24) * -0x30e4432345000000;
LAB_0039885e:
          uVar22 = (uint)((uVar12 ^ ms->hashSalt) >> (0x38U - cVar5 & 0x3f));
        }
        else {
          if (uVar19 == 6) {
            uVar12 = *(long *)(pBVar2 + uVar24) * -0x30e4432340650000;
            goto LAB_0039885e;
          }
          uVar22 = (*(int *)(pBVar2 + uVar24) * -0x61c8864f ^ (uint)ms->hashSalt) >>
                   (0x18U - cVar5 & 0x1f);
        }
        ms->hashCache[(uint)uVar24 & 7] = uVar22;
      }
      ms->lazySkipping = 0;
    }
    UVar23 = local_a4;
    local_38 = ms;
    for (ip = (int *)(litEnd + uVar26); UVar10 = UVar23, ms = local_38, piVar20 = ip, ip <= local_78
        ; ip = (int *)((long)ip + sVar11 + 4)) {
      uVar9 = ((int)ip - iVar25) - UVar10;
      pBVar14 = pBVar2;
      if (uVar9 < (uint)local_98) {
        pBVar14 = local_50;
      }
      if ((0xfffffffc < uVar9 - (uint)local_98) || (*(int *)(pBVar14 + uVar9) != *ip)) break;
      pBVar15 = iEnd;
      if (uVar9 < (uint)local_98) {
        pBVar15 = local_68;
      }
      sVar11 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar14 + uVar9) + 4),iEnd,pBVar15,
                          local_88);
      pBVar14 = psVar7->lit;
      if (litLimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar14,(BYTE *)ip,(BYTE *)ip,litLimit_w);
      }
      else {
        uVar6 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar14 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar14 + 8) = uVar6;
      }
      psVar13 = psVar7->sequences;
      psVar13->litLength = 0;
      psVar13->offBase = 1;
      if (0xffff < sVar11 + 1) {
        psVar7->longLengthType = ZSTD_llt_matchLength;
        psVar7->longLengthPos = (U32)((ulong)((long)psVar13 - (long)psVar7->sequencesStart) >> 3);
      }
      psVar13->mlBase = (U16)(sVar11 + 1);
      psVar7->sequences = psVar13 + 1;
      UVar23 = local_bc;
      local_bc = UVar10;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_dedicatedDictSearch_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2, ZSTD_dedicatedDictSearch);
}